

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_dwt_encode_1(OPJ_INT32 *a,OPJ_INT32 dn,OPJ_INT32 sn,OPJ_INT32 cas)

{
  int iVar1;
  OPJ_INT32 local_70;
  OPJ_INT32 local_6c;
  OPJ_INT32 local_64;
  OPJ_INT32 local_60;
  OPJ_INT32 local_5c;
  OPJ_INT32 local_58;
  OPJ_INT32 local_50;
  OPJ_INT32 local_4c;
  OPJ_INT32 local_48;
  OPJ_INT32 local_44;
  OPJ_INT32 local_3c;
  OPJ_INT32 local_38;
  OPJ_INT32 local_34;
  OPJ_INT32 local_30;
  OPJ_INT32 local_28;
  OPJ_INT32 local_24;
  int local_20;
  OPJ_INT32 i;
  OPJ_INT32 cas_local;
  OPJ_INT32 sn_local;
  OPJ_INT32 dn_local;
  OPJ_INT32 *a_local;
  
  if (cas == 0) {
    if ((0 < dn) || (1 < sn)) {
      for (local_20 = 0; local_20 < dn; local_20 = local_20 + 1) {
        if (local_20 < 0) {
          local_24 = *a;
        }
        else {
          if (local_20 < sn) {
            local_28 = a[local_20 << 1];
          }
          else {
            local_28 = a[(sn + -1) * 2];
          }
          local_24 = local_28;
        }
        if (local_20 + 1 < 0) {
          local_30 = *a;
        }
        else {
          if (local_20 + 1 < sn) {
            local_34 = a[(local_20 + 1) * 2];
          }
          else {
            local_34 = a[(sn + -1) * 2];
          }
          local_30 = local_34;
        }
        iVar1 = local_20 * 2 + 1;
        a[iVar1] = a[iVar1] - (local_24 + local_30 >> 1);
      }
      for (local_20 = 0; local_20 < sn; local_20 = local_20 + 1) {
        if (local_20 + -1 < 0) {
          local_38 = a[1];
        }
        else {
          if (local_20 + -1 < dn) {
            local_3c = a[(local_20 + -1) * 2 + 1];
          }
          else {
            local_3c = a[(dn + -1) * 2 + 1];
          }
          local_38 = local_3c;
        }
        if (local_20 < 0) {
          local_44 = a[1];
        }
        else {
          if (local_20 < dn) {
            local_48 = a[local_20 * 2 + 1];
          }
          else {
            local_48 = a[(dn + -1) * 2 + 1];
          }
          local_44 = local_48;
        }
        a[local_20 << 1] = (local_38 + local_44 + 2 >> 2) + a[local_20 << 1];
      }
    }
  }
  else if ((sn == 0) && (dn == 1)) {
    *a = *a << 1;
  }
  else {
    for (local_20 = 0; local_20 < dn; local_20 = local_20 + 1) {
      if (local_20 < 0) {
        local_4c = a[1];
      }
      else {
        if (local_20 < sn) {
          local_50 = a[local_20 * 2 + 1];
        }
        else {
          local_50 = a[(sn + -1) * 2 + 1];
        }
        local_4c = local_50;
      }
      if (local_20 + -1 < 0) {
        local_58 = a[1];
      }
      else {
        if (local_20 + -1 < sn) {
          local_5c = a[(local_20 + -1) * 2 + 1];
        }
        else {
          local_5c = a[(sn + -1) * 2 + 1];
        }
        local_58 = local_5c;
      }
      a[local_20 << 1] = a[local_20 << 1] - (local_4c + local_58 >> 1);
    }
    for (local_20 = 0; local_20 < sn; local_20 = local_20 + 1) {
      if (local_20 < 0) {
        local_60 = *a;
      }
      else {
        if (local_20 < dn) {
          local_64 = a[local_20 << 1];
        }
        else {
          local_64 = a[(dn + -1) * 2];
        }
        local_60 = local_64;
      }
      if (local_20 + 1 < 0) {
        local_6c = *a;
      }
      else {
        if (local_20 + 1 < dn) {
          local_70 = a[(local_20 + 1) * 2];
        }
        else {
          local_70 = a[(dn + -1) * 2];
        }
        local_6c = local_70;
      }
      iVar1 = local_20 * 2 + 1;
      a[iVar1] = (local_60 + local_6c + 2 >> 2) + a[iVar1];
    }
  }
  return;
}

Assistant:

static void opj_dwt_encode_1(OPJ_INT32 *a, OPJ_INT32 dn, OPJ_INT32 sn,
                             OPJ_INT32 cas)
{
    OPJ_INT32 i;

    if (!cas) {
        if ((dn > 0) || (sn > 1)) { /* NEW :  CASE ONE ELEMENT */
            for (i = 0; i < dn; i++) {
                OPJ_D(i) -= (OPJ_S_(i) + OPJ_S_(i + 1)) >> 1;
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) += (OPJ_D_(i - 1) + OPJ_D_(i) + 2) >> 2;
            }
        }
    } else {
        if (!sn && dn == 1) {       /* NEW :  CASE ONE ELEMENT */
            OPJ_S(0) *= 2;
        } else {
            for (i = 0; i < dn; i++) {
                OPJ_S(i) -= (OPJ_DD_(i) + OPJ_DD_(i - 1)) >> 1;
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) += (OPJ_SS_(i) + OPJ_SS_(i + 1) + 2) >> 2;
            }
        }
    }
}